

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_log_add_fd(int fd,float sample_ratio,char *_points,char *_snis,char *_addresses,int appdata
                   )

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  int iVar7;
  char *__ptr;
  in6_addr *piVar8;
  size_t sVar9;
  bool bVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  byte bVar26;
  ulong local_80;
  size_t slot_index;
  char *pcStack_70;
  in_addr v4;
  char *input_1;
  size_t index;
  char *input;
  size_t num_addresses;
  in6_addr *piStack_48;
  int ret;
  in6_addr *addresses;
  char *snis;
  char *points;
  int appdata_local;
  char *_addresses_local;
  char *_snis_local;
  char *_points_local;
  float sample_ratio_local;
  int fd_local;
  
  addresses = (in6_addr *)0x0;
  piStack_48 = (in6_addr *)0x0;
  pthread_mutex_lock((pthread_mutex_t *)&logctx.mutex);
  __ptr = duplicate_stringlist(_points);
  if (__ptr == (char *)0x0) {
    num_addresses._4_4_ = 0x201;
  }
  else {
    addresses = (in6_addr *)duplicate_stringlist(_snis);
    if (addresses == (in6_addr *)0x0) {
      num_addresses._4_4_ = 0x201;
    }
    else {
      input = (char *)0x0;
      index = (size_t)_addresses;
      while( true ) {
        bVar10 = false;
        if (index != 0) {
          bVar10 = *(char *)index != '\0';
        }
        if (!bVar10) break;
        input = input + 1;
        sVar9 = strlen((char *)index);
        index = sVar9 + 1 + index;
      }
      piStack_48 = (in6_addr *)malloc((long)(input + 1) * 0x10);
      if (piStack_48 == (in6_addr *)0x0) {
        num_addresses._4_4_ = 0x201;
      }
      else {
        input_1 = (char *)0x0;
        pcStack_70 = _addresses;
        while( true ) {
          bVar10 = false;
          if (pcStack_70 != (char *)0x0) {
            bVar10 = *pcStack_70 != '\0';
          }
          if (!bVar10) break;
          iVar7 = inet_pton(10,pcStack_70,piStack_48 + (long)input_1);
          if (iVar7 == 0) {
            iVar7 = inet_pton(2,pcStack_70,(void *)((long)&slot_index + 4));
            if (iVar7 != 0) {
              ptls_build_v4_mapped_v6_address
                        (piStack_48 + (long)input_1,(in_addr *)((long)&slot_index + 4));
              goto LAB_0011e216;
            }
          }
          else {
LAB_0011e216:
            piVar8 = piStack_48 + (long)input_1;
            cVar11 = -((piVar8->__in6_u).__u6_addr8[0] == in6addr_any);
            cVar12 = -((piVar8->__in6_u).__u6_addr8[1] == uRam000000000014e491);
            cVar13 = -((piVar8->__in6_u).__u6_addr8[2] == uRam000000000014e492);
            cVar14 = -((piVar8->__in6_u).__u6_addr8[3] == uRam000000000014e493);
            cVar15 = -((piVar8->__in6_u).__u6_addr8[4] == uRam000000000014e494);
            cVar16 = -((piVar8->__in6_u).__u6_addr8[5] == uRam000000000014e495);
            cVar17 = -((piVar8->__in6_u).__u6_addr8[6] == uRam000000000014e496);
            cVar18 = -((piVar8->__in6_u).__u6_addr8[7] == uRam000000000014e497);
            cVar19 = -((code)(piVar8->__in6_u).__u6_addr8[8] == EVP_aes_128_ecb);
            cVar20 = -((piVar8->__in6_u).__u6_addr8[9] == uRam000000000014e499);
            cVar21 = -((piVar8->__in6_u).__u6_addr8[10] == uRam000000000014e49a);
            cVar22 = -((piVar8->__in6_u).__u6_addr8[0xb] == uRam000000000014e49b);
            cVar23 = -((piVar8->__in6_u).__u6_addr8[0xc] == uRam000000000014e49c);
            cVar24 = -((piVar8->__in6_u).__u6_addr8[0xd] == uRam000000000014e49d);
            cVar25 = -((piVar8->__in6_u).__u6_addr8[0xe] == uRam000000000014e49e);
            bVar26 = -((piVar8->__in6_u).__u6_addr8[0xf] == uRam000000000014e49f);
            auVar1[1] = cVar12;
            auVar1[0] = cVar11;
            auVar1[2] = cVar13;
            auVar1[3] = cVar14;
            auVar1[4] = cVar15;
            auVar1[5] = cVar16;
            auVar1[6] = cVar17;
            auVar1[7] = cVar18;
            auVar1[8] = cVar19;
            auVar1[9] = cVar20;
            auVar1[10] = cVar21;
            auVar1[0xb] = cVar22;
            auVar1[0xc] = cVar23;
            auVar1[0xd] = cVar24;
            auVar1[0xe] = cVar25;
            auVar1[0xf] = bVar26;
            auVar2[1] = cVar12;
            auVar2[0] = cVar11;
            auVar2[2] = cVar13;
            auVar2[3] = cVar14;
            auVar2[4] = cVar15;
            auVar2[5] = cVar16;
            auVar2[6] = cVar17;
            auVar2[7] = cVar18;
            auVar2[8] = cVar19;
            auVar2[9] = cVar20;
            auVar2[10] = cVar21;
            auVar2[0xb] = cVar22;
            auVar2[0xc] = cVar23;
            auVar2[0xd] = cVar24;
            auVar2[0xe] = cVar25;
            auVar2[0xf] = bVar26;
            auVar6[1] = cVar14;
            auVar6[0] = cVar13;
            auVar6[2] = cVar15;
            auVar6[3] = cVar16;
            auVar6[4] = cVar17;
            auVar6[5] = cVar18;
            auVar6[6] = cVar19;
            auVar6[7] = cVar20;
            auVar6[8] = cVar21;
            auVar6[9] = cVar22;
            auVar6[10] = cVar23;
            auVar6[0xb] = cVar24;
            auVar6[0xc] = cVar25;
            auVar6[0xd] = bVar26;
            auVar5[1] = cVar15;
            auVar5[0] = cVar14;
            auVar5[2] = cVar16;
            auVar5[3] = cVar17;
            auVar5[4] = cVar18;
            auVar5[5] = cVar19;
            auVar5[6] = cVar20;
            auVar5[7] = cVar21;
            auVar5[8] = cVar22;
            auVar5[9] = cVar23;
            auVar5[10] = cVar24;
            auVar5[0xb] = cVar25;
            auVar5[0xc] = bVar26;
            auVar4[1] = cVar16;
            auVar4[0] = cVar15;
            auVar4[2] = cVar17;
            auVar4[3] = cVar18;
            auVar4[4] = cVar19;
            auVar4[5] = cVar20;
            auVar4[6] = cVar21;
            auVar4[7] = cVar22;
            auVar4[8] = cVar23;
            auVar4[9] = cVar24;
            auVar4[10] = cVar25;
            auVar4[0xb] = bVar26;
            auVar3[1] = cVar17;
            auVar3[0] = cVar16;
            auVar3[2] = cVar18;
            auVar3[3] = cVar19;
            auVar3[4] = cVar20;
            auVar3[5] = cVar21;
            auVar3[6] = cVar22;
            auVar3[7] = cVar23;
            auVar3[8] = cVar24;
            auVar3[9] = cVar25;
            auVar3[10] = bVar26;
            if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                         (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                         (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                         (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                         (ushort)((byte)(CONCAT19(bVar26,CONCAT18(cVar25,CONCAT17(cVar24,CONCAT16(
                                                  cVar23,CONCAT15(cVar22,CONCAT14(cVar21,CONCAT13(
                                                  cVar20,CONCAT12(cVar19,CONCAT11(cVar18,cVar17)))))
                                                  )))) >> 7) & 1) << 6 |
                         (ushort)((byte)(CONCAT18(bVar26,CONCAT17(cVar25,CONCAT16(cVar24,CONCAT15(
                                                  cVar23,CONCAT14(cVar22,CONCAT13(cVar21,CONCAT12(
                                                  cVar20,CONCAT11(cVar19,cVar18)))))))) >> 7) & 1)
                         << 7 | (ushort)(bVar26 >> 7) << 0xf) != 0xffff) {
              input_1 = input_1 + 1;
            }
          }
          sVar9 = strlen(pcStack_70);
          pcStack_70 = pcStack_70 + sVar9 + 1;
        }
        *(ulong *)&piStack_48[(long)input_1].__in6_u =
             CONCAT17(uRam000000000014e497,
                      CONCAT16(uRam000000000014e496,
                               CONCAT15(uRam000000000014e495,
                                        CONCAT14(uRam000000000014e494,
                                                 CONCAT13(uRam000000000014e493,
                                                          CONCAT12(uRam000000000014e492,
                                                                   CONCAT11(uRam000000000014e491,
                                                                            in6addr_any)))))));
        *(ulong *)((long)&piStack_48[(long)input_1].__in6_u + 8) =
             CONCAT17(uRam000000000014e49f,
                      CONCAT16(uRam000000000014e49e,
                               CONCAT15(uRam000000000014e49d,
                                        CONCAT14(uRam000000000014e49c,
                                                 CONCAT13(uRam000000000014e49b,
                                                          CONCAT12(uRam000000000014e49a,
                                                                   CONCAT11(uRam000000000014e499,
                                                                            EVP_aes_128_ecb)))))));
        for (local_80 = 0; (local_80 < 0x20 && (logctx.conns[local_80].points != (char *)0x0));
            local_80 = local_80 + 1) {
        }
        if (local_80 == 0x20) {
          num_addresses._4_4_ = 0x201;
        }
        else {
          logctx.conns[local_80].fd = fd;
          logctx.conns[local_80].points = __ptr;
          logctx.conns[local_80].snis = (char *)addresses;
          logctx.conns[local_80].addresses = piStack_48;
          logctx.conns[local_80].sample_ratio = sample_ratio;
          logctx.conns[local_80].field_0x24 =
               logctx.conns[local_80].field_0x24 & 0xfe | (byte)appdata & 1;
          ptls_log._generation = ptls_log._generation + 1;
          num_addresses._4_4_ = 0;
        }
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&logctx.mutex);
  if (num_addresses._4_4_ != 0) {
    free(__ptr);
    free(addresses);
    free(piStack_48);
  }
  return num_addresses._4_4_;
}

Assistant:

int ptls_log_add_fd(int fd, float sample_ratio, const char *_points, const char *_snis, const char *_addresses, int appdata)
{
#if PTLS_HAVE_LOG

    char *points = NULL, *snis = NULL;
    struct in6_addr *addresses = NULL;
    int ret;

    pthread_mutex_lock(&logctx.mutex);

    if ((points = duplicate_stringlist(_points)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((snis = duplicate_stringlist(_snis)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    {
        size_t num_addresses = 0;
        for (const char *input = _addresses; input != NULL && *input != '\0'; input += strlen(input) + 1)
            ++num_addresses;
        if ((addresses = malloc(sizeof(*addresses) * (num_addresses + 1))) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        size_t index = 0;
        for (const char *input = _addresses; input != NULL && *input != '\0'; input += strlen(input) + 1) {
            /* note: for consistency to the handling of points, erroneous input is ignored. V4 addresses will use the mapped form
             * (::ffff:192.0.2.1) */
            if (!inet_pton(AF_INET6, input, &addresses[index])) {
                struct in_addr v4;
                if (!inet_pton(AF_INET, input, &v4))
                    continue;
                ptls_build_v4_mapped_v6_address(&addresses[index], &v4);
            }
            if (memcmp(&addresses[index], &in6addr_any, sizeof(struct in6_addr)) == 0)
                continue;
            ++index;
        }
        addresses[index] = in6addr_any;
    }

    /* find slot, or return if not available */
    size_t slot_index;
    for (slot_index = 0; slot_index < PTLS_ELEMENTSOF(logctx.conns); ++slot_index)
        if (logctx.conns[slot_index].points == NULL)
            break;
    if (slot_index == PTLS_ELEMENTSOF(logctx.conns)) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* setup the slot */
    logctx.conns[slot_index].fd = fd;
    logctx.conns[slot_index].points = points;
    logctx.conns[slot_index].snis = snis;
    logctx.conns[slot_index].addresses = addresses;
    logctx.conns[slot_index].sample_ratio = sample_ratio;
    logctx.conns[slot_index].appdata = appdata;
    ++ptls_log._generation;

    ret = 0; /* success */

Exit:
    pthread_mutex_unlock(&logctx.mutex);
    if (ret != 0) {
        free(points);
        free(snis);
        free(addresses);
    }
    return ret;

#else
    return PTLS_ERROR_NOT_AVAILABLE;
#endif
}